

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-watcher-cross-stop.c
# Opt level: O2

int run_test_watcher_cross_stop(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_udp_send_t *puVar4;
  long lVar5;
  long lVar6;
  undefined8 uStack_460;
  undefined1 local_458 [16];
  sockaddr_in addr;
  char big_string [1024];
  
  uVar2 = uv_default_loop();
  big_string[0] = -0x1c;
  big_string[1] = '\t';
  big_string[2] = '\0';
  big_string[3] = '\0';
  big_string[4] = '\0';
  big_string[5] = '\0';
  big_string[6] = '\0';
  big_string[7] = '\0';
  big_string[8] = -0x1c;
  big_string[9] = '\t';
  big_string[10] = '\0';
  big_string[0xb] = '\0';
  big_string[0xc] = '\0';
  big_string[0xd] = '\0';
  big_string[0xe] = '\0';
  big_string[0xf] = '\0';
  iVar1 = setrlimit64(RLIMIT_NOFILE,(rlimit64 *)big_string);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s\n","File descriptor limit too low.");
    fflush(_stderr);
    return 1;
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    memset(big_string,0x41,0x400);
    local_458 = uv_buf_init(big_string,0x400);
    puVar4 = reqs;
    lVar6 = 0;
    do {
      if (lVar6 + 0xd8 == 0x83e38) goto LAB_00177b1a;
      lVar5 = (long)sockets[0].handle_queue + lVar6 + -0x20;
      iVar1 = uv_udp_init(uVar2,lVar5);
      if (iVar1 != 0) {
        pcVar3 = "0 == uv_udp_init(loop, &sockets[i])";
        uStack_460 = 0x54;
        goto LAB_00177c7b;
      }
      iVar1 = uv_udp_bind(lVar5,&addr,4);
      if (iVar1 != 0) {
        pcVar3 = "0 == uv_udp_bind(&sockets[i], (const struct sockaddr*) &addr, UV_UDP_REUSEADDR)";
        uStack_460 = 0x57;
        goto LAB_00177c7b;
      }
      iVar1 = uv_udp_recv_start(lVar5,alloc_cb,recv_cb);
      if (iVar1 != 0) {
        pcVar3 = "0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb)";
        uStack_460 = 0x58;
        goto LAB_00177c7b;
      }
      iVar1 = uv_udp_send(puVar4,lVar5,local_458,1,&addr,send_cb);
      puVar4 = puVar4 + 1;
      lVar6 = lVar6 + 0xd8;
    } while (iVar1 == 0);
    pcVar3 = 
    "0 == uv_udp_send(&reqs[i], &sockets[i], &buf, 1, (const struct sockaddr*) &addr, send_cb)";
    uStack_460 = 0x5e;
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_460 = 0x4f;
  }
LAB_00177c7b:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-watcher-cross-stop.c"
          ,uStack_460,pcVar3);
  abort();
LAB_00177b1a:
  while (recv_cb_called == 0) {
    uv_run(uVar2,1);
  }
  for (lVar6 = 0; lVar6 != 540000; lVar6 = lVar6 + 0xd8) {
    uv_close((long)sockets[0].handle_queue + lVar6 + -0x20);
  }
  if (recv_cb_called == 0) {
    pcVar3 = "recv_cb_called > 0";
    uStack_460 = 0x67;
  }
  else {
    uv_run(uVar2,0);
    if (send_cb_called == 0x9c4) {
      if (close_cb_called == 0x9c4) {
        uVar2 = uv_default_loop();
        uv_walk(uVar2,close_walk_cb,0);
        uv_run(uVar2,0);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uStack_460 = 0x6e;
      }
      else {
        pcVar3 = "ARRAY_SIZE(sockets) == close_cb_called";
        uStack_460 = 0x6c;
      }
    }
    else {
      pcVar3 = "ARRAY_SIZE(sockets) == send_cb_called";
      uStack_460 = 0x6b;
    }
  }
  goto LAB_00177c7b;
}

Assistant:

TEST_IMPL(watcher_cross_stop) {
#if defined(__MVS__)
  RETURN_SKIP("zOS does not allow address or port reuse when using UDP sockets");
#endif
  uv_loop_t* loop = uv_default_loop();
  unsigned int i;
  struct sockaddr_in addr;
  uv_buf_t buf;
  char big_string[1024];

  TEST_FILE_LIMIT(ARRAY_SIZE(sockets) + 32);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  memset(big_string, 'A', sizeof(big_string));
  buf = uv_buf_init(big_string, sizeof(big_string));

  for (i = 0; i < ARRAY_SIZE(sockets); i++) {
    ASSERT(0 == uv_udp_init(loop, &sockets[i]));
    ASSERT(0 == uv_udp_bind(&sockets[i],
                            (const struct sockaddr*) &addr,
                            UV_UDP_REUSEADDR));
    ASSERT(0 == uv_udp_recv_start(&sockets[i], alloc_cb, recv_cb));
    ASSERT(0 == uv_udp_send(&reqs[i],
                            &sockets[i],
                            &buf,
                            1,
                            (const struct sockaddr*) &addr,
                            send_cb));
  }

  while (recv_cb_called == 0)
    uv_run(loop, UV_RUN_ONCE);

  for (i = 0; i < ARRAY_SIZE(sockets); i++)
    uv_close((uv_handle_t*) &sockets[i], close_cb);

  ASSERT(recv_cb_called > 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(sockets) == send_cb_called);
  ASSERT(ARRAY_SIZE(sockets) == close_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}